

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Aig_Man_t * Saig_ManWindowExtractNodes(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_48;
  int local_44;
  int nRegCount;
  int i;
  Vec_Ptr_t *vNodesPo;
  Vec_Ptr_t *vNodesPi;
  Aig_Obj_t *pMatch;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vNodes_local;
  Aig_Man_t *p_local;
  
  Aig_ManCleanData(p);
  iVar1 = Vec_PtrSize(vNodes);
  p_00 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav("wnd");
  p_00->pName = pcVar2;
  p_00->pSpec = (char *)0x0;
  pAVar3 = Aig_ManConst1(p);
  pAVar4 = Aig_ManConst1(p_00);
  (pAVar3->field_5).pData = pAVar4;
  pVVar5 = Saig_ManWindowCollectPis(p,vNodes);
  for (local_44 = 0; iVar1 = Vec_PtrSize(pVVar5), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar6 = Vec_PtrEntry(pVVar5,local_44);
    pAVar3 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar3;
  }
  Vec_PtrFree(pVVar5);
  for (local_44 = 0; iVar1 = Vec_PtrSize(vNodes), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_44);
    iVar1 = Saig_ObjIsLo(p,pAVar3);
    if (iVar1 != 0) {
      pAVar4 = Aig_ObjCreateCi(p_00);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(vNodes), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_44);
    iVar1 = Aig_ObjIsNode(pAVar3);
    if (iVar1 != 0) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      p1 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p_00,pAVar4,p1);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  pVVar5 = Saig_ManWindowCollectPos(p,vNodes,(Vec_Ptr_t **)0x0);
  for (local_44 = 0; iVar1 = Vec_PtrSize(pVVar5), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar6 = Vec_PtrEntry(pVVar5,local_44);
    Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)((long)pvVar6 + 0x28));
  }
  Vec_PtrFree(pVVar5);
  local_48 = 0;
  for (local_44 = 0; iVar1 = Vec_PtrSize(vNodes), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_44);
    iVar1 = Saig_ObjIsLo(p,pAVar3);
    if (iVar1 != 0) {
      pAVar3 = Saig_ObjLoToLi(p,pAVar3);
      pAVar3 = Aig_ObjChild0Copy(pAVar3);
      Aig_ObjCreateCo(p_00,pAVar3);
      local_48 = local_48 + 1;
    }
  }
  Aig_ManSetRegNum(p_00,local_48);
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManWindowExtractNodes( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMatch;
    Vec_Ptr_t * vNodesPi, * vNodesPo;
    int i, nRegCount;
    Aig_ManCleanData( p ); 
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    pNew->pName = Abc_UtilStrsav( "wnd" );
    pNew->pSpec = NULL;
    // map constant nodes
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );
    // create real PIs
    vNodesPi = Saig_ManWindowCollectPis( p, vNodes );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodesPi, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    Vec_PtrFree( vNodesPi );
    // create register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Saig_ObjIsLo(p, pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    }
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }
    // create POs
    vNodesPo = Saig_ManWindowCollectPos( p, vNodes, NULL );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodesPo, pObj, i )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
    Vec_PtrFree( vNodesPo );
    // create register inputs
    nRegCount = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pMatch = Saig_ObjLoToLi( p, pObj );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch) );
            nRegCount++;
        }
    }
    Aig_ManSetRegNum( pNew, nRegCount );
    Aig_ManCleanup( pNew );
    return pNew;
}